

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstandardgestures.cpp
# Opt level: O2

Result __thiscall
QTapAndHoldGestureRecognizer::recognize
          (QTapAndHoldGestureRecognizer *this,QGesture *state,QObject *object,QEvent *event)

{
  short sVar1;
  long lVar2;
  int iVar3;
  QPoint QVar4;
  QPoint QVar5;
  QFlagsStorage<QGestureRecognizer::ResultFlag> QVar6;
  int iVar7;
  int iVar8;
  long in_FS_OFFSET;
  double dVar9;
  double in_XMM1_Qa;
  QPointF local_48;
  QPointF local_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  lVar2 = *(long *)&state->field_0x8;
  sVar1 = *(short *)(event + 8);
  if (sVar1 == 1 && object == &state->super_QObject) {
    QBasicTimer::stop();
    QVar6.i = 0x108;
    goto LAB_002ec8bf;
  }
  if (sVar1 == 2) {
    local_38 = QSinglePointEvent::globalPosition((QSinglePointEvent *)event);
    QVar4 = QPointF::toPoint(&local_38);
LAB_002ec800:
    dVar9 = (double)QVar4.xp.m_i.m_i;
    in_XMM1_Qa = (double)QVar4.yp.m_i.m_i;
LAB_002ec817:
    *(double *)(lVar2 + 0xa8) = dVar9;
    *(double *)(lVar2 + 0xb0) = in_XMM1_Qa;
    QGesture::setHotSpot(state,(QPointF *)(lVar2 + 0xa8));
    QBasicTimer::start((QBasicTimer *)(lVar2 + 0xb8),
                       (Duration)((long)QTapAndHoldGesturePrivate::Timeout * 1000000),
                       &state->super_QObject);
  }
  else {
    QVar6.i = 0x10;
    if (sVar1 == 3) goto LAB_002ec8bf;
    if (sVar1 == 5) {
      local_38 = QSinglePointEvent::globalPosition((QSinglePointEvent *)event);
      QVar4 = QPointF::toPoint(&local_38);
LAB_002ec878:
      QVar5 = QPointF::toPoint((QPointF *)(lVar2 + 0xa8));
      if (*(int *)(lVar2 + 0xb8) == 0) goto LAB_002ec8bf;
      iVar8 = QVar4.xp.m_i.m_i - QVar5.xp.m_i;
      iVar7 = QVar4.yp.m_i.m_i - QVar5.yp.m_i;
      iVar3 = -iVar8;
      if (0 < iVar8) {
        iVar3 = iVar8;
      }
      iVar8 = -iVar7;
      if (0 < iVar7) {
        iVar8 = iVar7;
      }
    }
    else {
      if (sVar1 == 0x9b) {
        QVar4 = QGraphicsSceneMouseEvent::screenPos((QGraphicsSceneMouseEvent *)event);
        goto LAB_002ec878;
      }
      if ((sVar1 == 0xc4) || (sVar1 == 0x9d)) goto LAB_002ec8bf;
      if (sVar1 == 0xc2) {
        dVar9 = (double)QEventPoint::globalPressPosition();
        goto LAB_002ec817;
      }
      if (sVar1 != 0xc3) {
        if (sVar1 != 0x9c) {
          QVar6.i = 1;
          goto LAB_002ec8bf;
        }
        QVar4 = QGraphicsSceneMouseEvent::screenPos((QGraphicsSceneMouseEvent *)event);
        goto LAB_002ec800;
      }
      if ((*(int *)(lVar2 + 0xb8) == 0) || (*(long *)(event + 0x38) != 1)) goto LAB_002ec8bf;
      local_38.xp = (qreal)QEventPoint::position();
      local_38.yp = in_XMM1_Qa;
      QVar4 = QPointF::toPoint(&local_38);
      local_48.xp = (qreal)QEventPoint::pressPosition();
      QVar5 = QPointF::toPoint(&local_48);
      iVar8 = QVar4.xp.m_i.m_i - QVar5.xp.m_i;
      iVar7 = QVar4.yp.m_i.m_i - QVar5.yp.m_i;
      iVar3 = -iVar8;
      if (0 < iVar8) {
        iVar3 = iVar8;
      }
      iVar8 = -iVar7;
      if (0 < iVar7) {
        iVar8 = iVar7;
      }
    }
    if (0x28 < iVar8 + iVar3) goto LAB_002ec8bf;
  }
  QVar6.i = 2;
LAB_002ec8bf:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return (QFlagsStorageHelper<QGestureRecognizer::ResultFlag,_4>)
         (QFlagsStorageHelper<QGestureRecognizer::ResultFlag,_4>)QVar6.i;
}

Assistant:

QGestureRecognizer::Result
QTapAndHoldGestureRecognizer::recognize(QGesture *state, QObject *object,
                                        QEvent *event)
{
    QTapAndHoldGesture *q = static_cast<QTapAndHoldGesture *>(state);
    QTapAndHoldGesturePrivate *d = q->d_func();

    if (object == state && event->type() == QEvent::Timer) {
        d->tapAndHoldTimer.stop();
        return QGestureRecognizer::FinishGesture | QGestureRecognizer::ConsumeEventHint;
    }

    enum { TapRadius = 40 };

    switch (event->type()) {
#if QT_CONFIG(graphicsview)
    case QEvent::GraphicsSceneMousePress: {
        const QGraphicsSceneMouseEvent *gsme = static_cast<const QGraphicsSceneMouseEvent *>(event);
        d->position = gsme->screenPos();
        q->setHotSpot(d->position);
        d->tapAndHoldTimer.start(QTapAndHoldGesturePrivate::Timeout * 1ms, q);
        return QGestureRecognizer::MayBeGesture; // we don't show a sign of life until the timeout
    }
#endif
    case QEvent::MouseButtonPress: {
        const QMouseEvent *me = static_cast<const QMouseEvent *>(event);
        d->position = me->globalPosition().toPoint();
        q->setHotSpot(d->position);
        d->tapAndHoldTimer.start(QTapAndHoldGesturePrivate::Timeout * 1ms, q);
        return QGestureRecognizer::MayBeGesture; // we don't show a sign of life until the timeout
    }
    case QEvent::TouchBegin: {
        const QTouchEvent *ev = static_cast<const QTouchEvent *>(event);
        d->position = ev->points().at(0).globalPressPosition();
        q->setHotSpot(d->position);
        d->tapAndHoldTimer.start(QTapAndHoldGesturePrivate::Timeout * 1ms, q);
        return QGestureRecognizer::MayBeGesture; // we don't show a sign of life until the timeout
    }
#if QT_CONFIG(graphicsview)
    case QEvent::GraphicsSceneMouseRelease:
#endif
    case QEvent::MouseButtonRelease:
    case QEvent::TouchEnd:
        return QGestureRecognizer::CancelGesture; // get out of the MayBeGesture state
    case QEvent::TouchUpdate: {
        const QTouchEvent *ev = static_cast<const QTouchEvent *>(event);
        if (d->tapAndHoldTimer.isActive() && ev->points().size() == 1) {
            const QEventPoint &p = ev->points().at(0);
            QPoint delta = p.position().toPoint() - p.pressPosition().toPoint();
            if (delta.manhattanLength() <= TapRadius)
                return QGestureRecognizer::MayBeGesture;
        }
        return QGestureRecognizer::CancelGesture;
    }
    case QEvent::MouseMove: {
        const QMouseEvent *me = static_cast<const QMouseEvent *>(event);
        QPoint delta = me->globalPosition().toPoint() - d->position.toPoint();
        if (d->tapAndHoldTimer.isActive() && delta.manhattanLength() <= TapRadius)
            return QGestureRecognizer::MayBeGesture;
        return QGestureRecognizer::CancelGesture;
    }
#if QT_CONFIG(graphicsview)
    case QEvent::GraphicsSceneMouseMove: {
        const QGraphicsSceneMouseEvent *gsme = static_cast<const QGraphicsSceneMouseEvent *>(event);
        QPoint delta = gsme->screenPos() - d->position.toPoint();
        if (d->tapAndHoldTimer.isActive() && delta.manhattanLength() <= TapRadius)
            return QGestureRecognizer::MayBeGesture;
        return QGestureRecognizer::CancelGesture;
    }
#endif
    default:
        return QGestureRecognizer::Ignore;
    }
}